

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_int32 *
ma_dr_flac__full_read_and_close_s32
          (ma_dr_flac *pFlac,uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalPCMFrameCountOut)

{
  ma_allocation_callbacks *pAllocationCallbacks;
  _func_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  size_t sVar4;
  ma_uint64 mVar5;
  ma_uint64 mVar6;
  ma_int32 *pmVar7;
  long lVar8;
  ulong uVar9;
  ma_uint64 mVar10;
  ma_int32 buffer [4096];
  ma_int32 *local_4068;
  ma_int32 local_4038 [4098];
  
  if (pFlac->totalPCMFrameCount == 0) {
    pAllocationCallbacks = &pFlac->allocationCallbacks;
    p_Var1 = (pFlac->allocationCallbacks).onMalloc;
    if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
      p_Var2 = (pFlac->allocationCallbacks).onRealloc;
      if (p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto LAB_00177335;
      local_4068 = (ma_int32 *)(*p_Var2)((void *)0x0,0x4000,pAllocationCallbacks->pUserData);
    }
    else {
      local_4068 = (ma_int32 *)(*p_Var1)(0x4000,pAllocationCallbacks->pUserData);
    }
    if (local_4068 == (ma_int32 *)0x0) goto LAB_00177335;
    mVar6 = ma_dr_flac_read_pcm_frames_s32
                      (pFlac,(ulong)(ushort)(0x1000 / pFlac->channels),local_4038);
    if (mVar6 == 0) {
      sVar4 = 0x4000;
      mVar5 = 0;
    }
    else {
      sVar4 = 0x4000;
      mVar10 = 0;
      do {
        mVar5 = mVar10 + mVar6;
        uVar9 = (ulong)pFlac->channels;
        if (sVar4 < mVar5 * uVar9 * 4) {
          pmVar7 = (ma_int32 *)
                   ma_dr_flac__realloc_from_callbacks
                             (local_4068,sVar4 * 2,sVar4,pAllocationCallbacks);
          if (pmVar7 == (ma_int32 *)0x0) {
            if ((local_4068 != (ma_int32 *)0x0) &&
               (p_Var3 = (pFlac->allocationCallbacks).onFree,
               p_Var3 != (_func_void_void_ptr_void_ptr *)0x0)) {
              (*p_Var3)(local_4068,pAllocationCallbacks->pUserData);
            }
            goto LAB_00177335;
          }
          uVar9 = (ulong)pFlac->channels;
          local_4068 = pmVar7;
          sVar4 = sVar4 * 2;
        }
        memcpy(local_4068 + mVar10 * uVar9,local_4038,mVar6 * uVar9 * 4);
        mVar6 = ma_dr_flac_read_pcm_frames_s32
                          (pFlac,(ulong)(ushort)(0x1000 / pFlac->channels),local_4038);
        mVar10 = mVar5;
      } while (mVar6 != 0);
    }
    lVar8 = pFlac->channels * mVar5;
    memset(local_4068 + lVar8,0,sVar4 + lVar8 * -4);
  }
  else {
    sVar4 = pFlac->totalPCMFrameCount * (ulong)pFlac->channels * 4;
    p_Var1 = (pFlac->allocationCallbacks).onMalloc;
    if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
      p_Var2 = (pFlac->allocationCallbacks).onRealloc;
      if (p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto LAB_00177335;
      local_4068 = (ma_int32 *)(*p_Var2)((void *)0x0,sVar4,(pFlac->allocationCallbacks).pUserData);
    }
    else {
      local_4068 = (ma_int32 *)(*p_Var1)(sVar4,(pFlac->allocationCallbacks).pUserData);
    }
    if (local_4068 == (ma_int32 *)0x0) {
LAB_00177335:
      local_4068 = (ma_int32 *)0x0;
      goto LAB_00177338;
    }
    mVar5 = ma_dr_flac_read_pcm_frames_s32(pFlac,pFlac->totalPCMFrameCount,local_4068);
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = pFlac->sampleRate;
  }
  if (channelsOut != (uint *)0x0) {
    *channelsOut = (uint)pFlac->channels;
  }
  if (totalPCMFrameCountOut != (ma_uint64 *)0x0) {
    *totalPCMFrameCountOut = mVar5;
  }
LAB_00177338:
  ma_dr_flac_close(pFlac);
  return local_4068;
}

Assistant:

ma_int32* ma_dr_flac_open_and_read_pcm_frames_s32(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalPCMFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalPCMFrameCountOut) {
        *totalPCMFrameCountOut = 0;
    }
    pFlac = ma_dr_flac_open(onRead, onSeek, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s32(pFlac, channelsOut, sampleRateOut, totalPCMFrameCountOut);
}